

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O2

void __thiscall duckdb::Pipeline::ResetSource(Pipeline *this,bool force)

{
  _Head_base<0UL,_duckdb::GlobalSourceState_*,_false> _Var1;
  _Alloc_hider _Var2;
  int iVar3;
  PhysicalOperator *pPVar4;
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if ((this->source).ptr != (PhysicalOperator *)0x0) {
    pPVar4 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->source);
    iVar3 = (*pPVar4->_vptr_PhysicalOperator[0x13])(pPVar4);
    if ((char)iVar3 == '\0') {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Source of pipeline does not have IsSource set",&local_39);
      InternalException::InternalException(this_00,&local_38);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  if ((force) ||
     ((this->source_state).
      super_unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
      .super__Head_base<0UL,_duckdb::GlobalSourceState_*,_false>._M_head_impl ==
      (GlobalSourceState *)0x0)) {
    pPVar4 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->source);
    (*pPVar4->_vptr_PhysicalOperator[0x10])(&local_38,pPVar4,this->executor->context);
    _Var2._M_p = local_38._M_dataplus._M_p;
    local_38._M_dataplus._M_p = (pointer)0x0;
    _Var1._M_head_impl =
         (this->source_state).
         super_unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
         .super__Head_base<0UL,_duckdb::GlobalSourceState_*,_false>._M_head_impl;
    (this->source_state).
    super_unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
    .super__Head_base<0UL,_duckdb::GlobalSourceState_*,_false>._M_head_impl =
         (GlobalSourceState *)_Var2._M_p;
    if (_Var1._M_head_impl != (GlobalSourceState *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_GlobalSourceState + 8))();
      if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      }
    }
  }
  return;
}

Assistant:

void Pipeline::ResetSource(bool force) {
	if (source && !source->IsSource()) {
		throw InternalException("Source of pipeline does not have IsSource set");
	}
	if (force || !source_state) {
		source_state = source->GetGlobalSourceState(GetClientContext());
	}
}